

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int encode_with_and_without_superres
              (AV1_COMP *cpi,size_t *size,uint8_t *dest,size_t dest_size,int *largest_tile_id)

{
  char cVar1;
  char cVar2;
  int iVar3;
  long *in_RDI;
  undefined4 *in_R8;
  double dVar4;
  int64_t rate3_1;
  int64_t sse3_1;
  double proj_rdcost2_1;
  int64_t rdmult_1;
  int64_t rate3;
  int64_t sse3;
  double proj_rdcost2;
  double this_rdcost;
  int this_largest_tile_id;
  int64_t this_rate;
  int64_t this_sse;
  int this_index_2;
  int denom_2;
  int best_denom;
  int64_t rdmult;
  int this_index_1;
  int denom_1;
  int this_index;
  int denom;
  int superres_largest_tile_ids [8];
  int64_t superres_rates [8];
  int64_t superres_sses [8];
  SuperResCfg *superres_cfg;
  aom_bit_depth_t bit_depth;
  FRAME_UPDATE_TYPE update_type;
  GF_GROUP *gf_group;
  double proj_rdcost1;
  int largest_tile_id2;
  int64_t rate2;
  int64_t sse2;
  int largest_tile_id1;
  int64_t rate1;
  int64_t sse1;
  aom_codec_err_t err;
  AV1_COMMON *cm;
  undefined8 in_stack_fffffffffffffe70;
  aom_tune_metric tuning;
  undefined8 in_stack_fffffffffffffe78;
  aom_bit_depth_t bit_depth_00;
  undefined8 in_stack_fffffffffffffe80;
  int local_158;
  int local_154;
  int local_144;
  int local_13c;
  undefined4 local_138 [8];
  long local_118 [3];
  int64_t *in_stack_ffffffffffffff00;
  int64_t *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  uint8_t *in_stack_ffffffffffffff18;
  size_t *in_stack_ffffffffffffff20;
  AV1_COMP *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff40;
  double local_78;
  undefined4 local_6c;
  int local_3c;
  
  av1_save_all_coding_context((AV1_COMP *)0x22b98d);
  bit_depth_00 = (aom_bit_depth_t)in_stack_fffffffffffffe80;
  tuning = (aom_tune_metric)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  local_78 = 1.79769313486232e+308;
  cVar1 = *(char *)(*in_RDI + 400 + (ulong)*(byte *)(in_RDI + 0xe258));
  cVar2 = (char)*(undefined4 *)(in_RDI[0x8401] + 0x48);
  if (*(char *)((long)in_RDI + 0x608d4) == '\0') {
    if ((cVar1 == '\x04') || (cVar1 == '\x05')) {
      for (local_144 = 9; local_144 < 0x11; local_144 = local_144 + 1) {
        iVar3 = local_144 + -9;
        *(undefined8 *)(&stack0xffffffffffffff28 + (long)iVar3 * 8) = 0x7fffffffffffffff;
        local_118[iVar3] = 0x7fffffffffffffff;
        local_138[iVar3] = 0;
      }
    }
    else {
      local_13c = 9;
      while( true ) {
        bit_depth_00 = (aom_bit_depth_t)in_stack_fffffffffffffe80;
        tuning = (aom_tune_metric)((ulong)in_stack_fffffffffffffe70 >> 0x20);
        if (0x10 < local_13c) break;
        *(char *)((long)in_RDI + 0x42414) = (char)local_13c;
        *(char *)((long)in_RDI + 0x42415) = (char)local_13c;
        *(undefined4 *)(in_RDI + 0x13a99) = 4;
        iVar3 = encode_with_recode_loop_and_filter
                          (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                           in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                           in_stack_ffffffffffffff40);
        *(undefined4 *)(in_RDI + 0x13a99) = 0;
        if (iVar3 != 0) {
          return iVar3;
        }
        restore_all_coding_context((AV1_COMP *)0x22bbaf);
        local_13c = local_13c + 1;
      }
      *(undefined1 *)((long)in_RDI + 0x42414) = 8;
      *(undefined1 *)((long)in_RDI + 0x42415) = 8;
    }
    iVar3 = encode_with_recode_loop_and_filter
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
                       ,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                       in_stack_ffffffffffffff00,in_stack_ffffffffffffff40);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = av1_compute_rd_mult_based_on_qindex
                      (bit_depth_00,(FRAME_UPDATE_TYPE)((ulong)in_stack_fffffffffffffe78 >> 0x38),
                       (int)in_stack_fffffffffffffe78,tuning);
    local_154 = -1;
    for (local_158 = 9; local_158 < 0x11; local_158 = local_158 + 1) {
      dVar4 = (double)(*(long *)(&stack0xffffffffffffff28 + (long)(local_158 + -9) * 8) >>
                      ((cVar2 + -8) * '\x02' & 0x3fU)) * 128.0 +
              ((double)local_118[local_158 + -9] * (double)(long)iVar3) / 512.0;
      if (dVar4 < local_78) {
        local_154 = local_158;
        local_78 = dVar4;
      }
    }
    if ((double)(0x7fffffffffffffff >> ((cVar2 + -8) * '\x02' & 0x3fU)) * 128.0 +
        ((double)(long)iVar3 * 9.223372036854776e+18) / 512.0 <= local_78) {
      *in_R8 = local_6c;
      local_3c = 0;
    }
    else {
      restore_all_coding_context((AV1_COMP *)0x22be89);
      *(char *)((long)in_RDI + 0x42414) = (char)local_154;
      *(char *)((long)in_RDI + 0x42415) = (char)local_154;
      *(undefined4 *)(in_RDI + 0x13a99) = 4;
      local_3c = encode_with_recode_loop_and_filter
                           (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                            in_stack_ffffffffffffff40);
      *(undefined4 *)(in_RDI + 0x13a99) = 0;
      *(undefined1 *)((long)in_RDI + 0x42414) = 8;
      *(undefined1 *)((long)in_RDI + 0x42415) = 8;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x13a99) = 4;
    iVar3 = encode_with_recode_loop_and_filter
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
                       ,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                       in_stack_ffffffffffffff00,in_stack_ffffffffffffff40);
    *(undefined4 *)(in_RDI + 0x13a99) = 0;
    if (iVar3 != 0) {
      return iVar3;
    }
    restore_all_coding_context((AV1_COMP *)0x22bff5);
    iVar3 = encode_with_recode_loop_and_filter
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
                       ,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                       in_stack_ffffffffffffff00,in_stack_ffffffffffffff40);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = av1_compute_rd_mult_based_on_qindex
                      (bit_depth_00,(FRAME_UPDATE_TYPE)((ulong)in_stack_fffffffffffffe78 >> 0x38),
                       (int)in_stack_fffffffffffffe78,tuning);
    if ((double)(0x7fffffffffffffff >> ((cVar2 + -8) * '\x02' & 0x3fU)) * 128.0 +
        ((double)(long)iVar3 * 9.223372036854776e+18) / 512.0 <=
        (double)(0x7fffffffffffffff >> ((cVar2 + -8) * '\x02' & 0x3fU)) * 128.0 +
        ((double)(long)iVar3 * 9.223372036854776e+18) / 512.0) {
      *in_R8 = local_6c;
      local_3c = 0;
    }
    else {
      restore_all_coding_context((AV1_COMP *)0x22c166);
      *(undefined4 *)(in_RDI + 0x13a99) = 4;
      local_3c = encode_with_recode_loop_and_filter
                           (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                            in_stack_ffffffffffffff40);
      *(undefined4 *)(in_RDI + 0x13a99) = 0;
    }
  }
  return local_3c;
}

Assistant:

static int encode_with_and_without_superres(AV1_COMP *cpi, size_t *size,
                                            uint8_t *dest, size_t dest_size,
                                            int *largest_tile_id) {
  const AV1_COMMON *const cm = &cpi->common;
  assert(cm->seq_params->enable_superres);
  assert(av1_superres_in_recode_allowed(cpi));
  aom_codec_err_t err = AOM_CODEC_OK;
  av1_save_all_coding_context(cpi);

  int64_t sse1 = INT64_MAX;
  int64_t rate1 = INT64_MAX;
  int largest_tile_id1 = 0;
  int64_t sse2 = INT64_MAX;
  int64_t rate2 = INT64_MAX;
  int largest_tile_id2;
  double proj_rdcost1 = DBL_MAX;
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const FRAME_UPDATE_TYPE update_type =
      gf_group->update_type[cpi->gf_frame_index];
  const aom_bit_depth_t bit_depth = cm->seq_params->bit_depth;

  // Encode with superres.
  if (cpi->sf.hl_sf.superres_auto_search_type == SUPERRES_AUTO_ALL) {
    SuperResCfg *const superres_cfg = &cpi->oxcf.superres_cfg;
    int64_t superres_sses[SCALE_NUMERATOR];
    int64_t superres_rates[SCALE_NUMERATOR];
    int superres_largest_tile_ids[SCALE_NUMERATOR];
    // Use superres for Key-frames and Alt-ref frames only.
    if (update_type != OVERLAY_UPDATE && update_type != INTNL_OVERLAY_UPDATE) {
      for (int denom = SCALE_NUMERATOR + 1; denom <= 2 * SCALE_NUMERATOR;
           ++denom) {
        superres_cfg->superres_scale_denominator = denom;
        superres_cfg->superres_kf_scale_denominator = denom;
        const int this_index = denom - (SCALE_NUMERATOR + 1);

        cpi->superres_mode = AOM_SUPERRES_AUTO;  // Super-res on for this loop.
        err = encode_with_recode_loop_and_filter(
            cpi, size, dest, dest_size, &superres_sses[this_index],
            &superres_rates[this_index],
            &superres_largest_tile_ids[this_index]);
        cpi->superres_mode = AOM_SUPERRES_NONE;  // Reset to default (full-res).
        if (err != AOM_CODEC_OK) return err;
        restore_all_coding_context(cpi);
      }
      // Reset.
      superres_cfg->superres_scale_denominator = SCALE_NUMERATOR;
      superres_cfg->superres_kf_scale_denominator = SCALE_NUMERATOR;
    } else {
      for (int denom = SCALE_NUMERATOR + 1; denom <= 2 * SCALE_NUMERATOR;
           ++denom) {
        const int this_index = denom - (SCALE_NUMERATOR + 1);
        superres_sses[this_index] = INT64_MAX;
        superres_rates[this_index] = INT64_MAX;
        superres_largest_tile_ids[this_index] = 0;
      }
    }
    // Encode without superres.
    assert(cpi->superres_mode == AOM_SUPERRES_NONE);
    err = encode_with_recode_loop_and_filter(cpi, size, dest, dest_size, &sse2,
                                             &rate2, &largest_tile_id2);
    if (err != AOM_CODEC_OK) return err;

    // Note: Both use common rdmult based on base qindex of fullres.
    const int64_t rdmult = av1_compute_rd_mult_based_on_qindex(
        bit_depth, update_type, cm->quant_params.base_qindex,
        cpi->oxcf.tune_cfg.tuning);

    // Find the best rdcost among all superres denoms.
    int best_denom = -1;
    for (int denom = SCALE_NUMERATOR + 1; denom <= 2 * SCALE_NUMERATOR;
         ++denom) {
      const int this_index = denom - (SCALE_NUMERATOR + 1);
      const int64_t this_sse = superres_sses[this_index];
      const int64_t this_rate = superres_rates[this_index];
      const int this_largest_tile_id = superres_largest_tile_ids[this_index];
      const double this_rdcost = RDCOST_DBL_WITH_NATIVE_BD_DIST(
          rdmult, this_rate, this_sse, bit_depth);
      if (this_rdcost < proj_rdcost1) {
        sse1 = this_sse;
        rate1 = this_rate;
        largest_tile_id1 = this_largest_tile_id;
        proj_rdcost1 = this_rdcost;
        best_denom = denom;
      }
    }
    const double proj_rdcost2 =
        RDCOST_DBL_WITH_NATIVE_BD_DIST(rdmult, rate2, sse2, bit_depth);
    // Re-encode with superres if it's better.
    if (proj_rdcost1 < proj_rdcost2) {
      restore_all_coding_context(cpi);
      // TODO(urvang): We should avoid rerunning the recode loop by saving
      // previous output+state, or running encode only for the selected 'q' in
      // previous step.
      // Again, temporarily force the best denom.
      superres_cfg->superres_scale_denominator = best_denom;
      superres_cfg->superres_kf_scale_denominator = best_denom;
      int64_t sse3 = INT64_MAX;
      int64_t rate3 = INT64_MAX;
      cpi->superres_mode =
          AOM_SUPERRES_AUTO;  // Super-res on for this recode loop.
      err = encode_with_recode_loop_and_filter(cpi, size, dest, dest_size,
                                               &sse3, &rate3, largest_tile_id);
      cpi->superres_mode = AOM_SUPERRES_NONE;  // Reset to default (full-res).
      assert(sse1 == sse3);
      assert(rate1 == rate3);
      assert(largest_tile_id1 == *largest_tile_id);
      // Reset.
      superres_cfg->superres_scale_denominator = SCALE_NUMERATOR;
      superres_cfg->superres_kf_scale_denominator = SCALE_NUMERATOR;
    } else {
      *largest_tile_id = largest_tile_id2;
    }
  } else {
    assert(cpi->sf.hl_sf.superres_auto_search_type == SUPERRES_AUTO_DUAL);
    cpi->superres_mode =
        AOM_SUPERRES_AUTO;  // Super-res on for this recode loop.
    err = encode_with_recode_loop_and_filter(cpi, size, dest, dest_size, &sse1,
                                             &rate1, &largest_tile_id1);
    cpi->superres_mode = AOM_SUPERRES_NONE;  // Reset to default (full-res).
    if (err != AOM_CODEC_OK) return err;
    restore_all_coding_context(cpi);
    // Encode without superres.
    assert(cpi->superres_mode == AOM_SUPERRES_NONE);
    err = encode_with_recode_loop_and_filter(cpi, size, dest, dest_size, &sse2,
                                             &rate2, &largest_tile_id2);
    if (err != AOM_CODEC_OK) return err;

    // Note: Both use common rdmult based on base qindex of fullres.
    const int64_t rdmult = av1_compute_rd_mult_based_on_qindex(
        bit_depth, update_type, cm->quant_params.base_qindex,
        cpi->oxcf.tune_cfg.tuning);
    proj_rdcost1 =
        RDCOST_DBL_WITH_NATIVE_BD_DIST(rdmult, rate1, sse1, bit_depth);
    const double proj_rdcost2 =
        RDCOST_DBL_WITH_NATIVE_BD_DIST(rdmult, rate2, sse2, bit_depth);
    // Re-encode with superres if it's better.
    if (proj_rdcost1 < proj_rdcost2) {
      restore_all_coding_context(cpi);
      // TODO(urvang): We should avoid rerunning the recode loop by saving
      // previous output+state, or running encode only for the selected 'q' in
      // previous step.
      int64_t sse3 = INT64_MAX;
      int64_t rate3 = INT64_MAX;
      cpi->superres_mode =
          AOM_SUPERRES_AUTO;  // Super-res on for this recode loop.
      err = encode_with_recode_loop_and_filter(cpi, size, dest, dest_size,
                                               &sse3, &rate3, largest_tile_id);
      cpi->superres_mode = AOM_SUPERRES_NONE;  // Reset to default (full-res).
      assert(sse1 == sse3);
      assert(rate1 == rate3);
      assert(largest_tile_id1 == *largest_tile_id);
    } else {
      *largest_tile_id = largest_tile_id2;
    }
  }

  return err;
}